

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcmesh.cpp
# Opt level: O0

int __thiscall TPZCompMesh::InsertMaterialObject(TPZCompMesh *this,TPZMaterial *mat)

{
  bool bVar1;
  mapped_type *ppTVar2;
  size_type sVar3;
  mapped_type in_RSI;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *unaff_retaddr;
  int matid;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_30;
  _Self local_28;
  undefined4 local_1c;
  mapped_type local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  if (in_RSI == (mapped_type)0x0) {
    iVar4 = -1;
  }
  else {
    local_18 = in_RSI;
    local_1c = (**(code **)(*(long *)in_RSI + 0x58))();
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
         ::find(in_stack_ffffffffffffffb8,(key_type *)0x1a87ba2);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (bVar1) {
      pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
    }
    ppTVar2 = std::
              map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
              ::operator[](unaff_retaddr,
                           (key_type *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                          );
    *ppTVar2 = local_18;
    sVar3 = std::
            map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
            ::size((map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
                    *)0x1a87c1c);
    iVar4 = (int)sVar3;
  }
  return iVar4;
}

Assistant:

int TPZCompMesh::InsertMaterialObject(TPZMaterial * mat) {
	if(!mat) return -1;
	int matid = mat->Id();
    if (fMaterialVec.find(matid) != fMaterialVec.end()) {
        DebugStop();
    }
	fMaterialVec[matid] = mat;
	return fMaterialVec.size();
}